

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O2

void printid(void)

{
  sz_pid_t v;
  self *psVar1;
  SourceFile file;
  SourceFile file_00;
  Logger local_1030;
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  string local_40;
  Timestamp local_20;
  
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_60,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_60._0_8_;
    file.m_size = local_60._8_4_;
    sznet::Logger::Logger(&local_1030,file,0x17);
    psVar1 = sznet::LogStream::operator<<(&local_1030.m_impl.m_stream,"pid = ");
    v = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar1,v);
    sznet::Logger::~Logger(&local_1030);
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<111>
                ((SourceFile *)local_50,
                 (char (*) [111])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_50._0_8_;
      file_00.m_size = local_50._8_4_;
      sznet::Logger::Logger(&local_1030,file_00,0x18);
      psVar1 = sznet::LogStream::operator<<(&local_1030.m_impl.m_stream,"now ");
      local_20 = sznet::Timestamp::now();
      sznet::Timestamp::toFormattedString_abi_cxx11_(&local_40,&local_20,true);
      sznet::LogStream::operator<<(psVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      sznet::Logger::~Logger(&local_1030);
    }
  }
  return;
}

Assistant:

void printid()
{
	LOG_INFO << "pid = " << CurrentThread::tid();
	LOG_INFO << "now " << Timestamp::now().toFormattedString();
}